

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_scalar_inverse_var(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  secp256k1_scalar *in_RDI;
  secp256k1_scalar *unaff_retaddr;
  bench_inv *data;
  secp256k1_scalar *in_stack_00000010;
  int j;
  int i;
  int local_14;
  int local_10;
  
  local_14 = 0;
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    secp256k1_scalar_inverse_var(unaff_retaddr,in_RDI);
    iVar1 = secp256k1_scalar_add(in_stack_00000010,data->scalar,unaff_retaddr);
    local_14 = iVar1 + local_14;
  }
  if (in_ESI < local_14) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_internal.c"
            ,0xac,"test condition failed: j <= iters");
    abort();
  }
  return;
}

Assistant:

static void bench_scalar_inverse_var(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_scalar_inverse_var(&data->scalar[0], &data->scalar[0]);
        j += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(j <= iters);
}